

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

int arkStep_fe_Adj(sunrealtype t,N_Vector sens_partial_stage,N_Vector sens_complete_stage,
                  void *content)

{
  long in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  sunrealtype checkpoint_t;
  N_Vector checkpoint;
  void *user_data;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  SUNAdjointCheckpointScheme check_scheme;
  SUNAdjointStepper adj_stepper;
  SUNErrCode errcode;
  undefined8 local_68;
  N_Vector local_60;
  undefined8 local_58;
  long local_50;
  long local_48;
  undefined8 local_40;
  int local_2c;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  int local_4;
  
  local_2c = 0;
  local_40 = *(undefined8 *)(in_RDX + 0x28);
  local_48 = **(long **)(in_RDX + 0x10);
  if (*(long *)(local_48 + 0x88) == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0xd98,"arkStep_fe_Adj",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    local_50 = *(long *)(local_48 + 0x88);
    local_58 = *(undefined8 *)(in_RDX + 0x30);
    local_20 = in_RSI;
    local_18 = in_RDI;
    local_10 = in_XMM0_Qa;
    local_60 = N_VGetSubvector_ManyVector(*(N_Vector *)(local_48 + 0x270),0);
    local_68 = 0;
    *(undefined4 *)(local_48 + 0x40c) = 0;
    local_2c = SUNAdjointCheckpointScheme_LoadVector
                         (local_40,*(undefined8 *)(local_48 + 0x420),
                          *(undefined8 *)(local_48 + 0x418),0,&local_60,&local_68);
    if (local_2c == -0x26f7) {
      *(undefined4 *)(local_48 + 0x40c) = 1;
      local_4 = 1;
    }
    else {
      local_4 = (**(code **)(local_50 + 0x28))(local_10,local_60,local_18,local_20,local_58);
    }
  }
  return local_4;
}

Assistant:

int arkStep_fe_Adj(sunrealtype t, N_Vector sens_partial_stage,
                   N_Vector sens_complete_stage, void* content)
{
  SUNErrCode errcode = SUN_SUCCESS;

  SUNAdjointStepper adj_stepper           = (SUNAdjointStepper)content;
  SUNAdjointCheckpointScheme check_scheme = adj_stepper->checkpoint_scheme;
  ARKodeMem ark_mem = (ARKodeMem)adj_stepper->adj_sunstepper->content;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }

  ARKodeARKStepMem step_mem = (ARKodeARKStepMem)ark_mem->step_mem;
  void* user_data           = adj_stepper->user_data;

  N_Vector checkpoint      = N_VGetSubvector_ManyVector(ark_mem->tempv2, 0);
  sunrealtype checkpoint_t = SUN_RCONST(0.0);

  ark_mem->load_checkpoint_fail = SUNFALSE;

  errcode = SUNAdjointCheckpointScheme_LoadVector(check_scheme,
                                                  ark_mem->adj_step_idx,
                                                  ark_mem->adj_stage_idx, 0,
                                                  &checkpoint, &checkpoint_t);

  /* Checkpoint was not found, recompute the missing step */
  if (errcode == SUN_ERR_CHECKPOINT_NOT_FOUND)
  {
    ark_mem->load_checkpoint_fail = SUNTRUE;
    return +1;
  }

  /* Evaluate f_{y}^*(t_i, z_i, p) \Lambda_i and f_{p}^*(t_i, z_i, p) \nu_i */
  return step_mem->adj_fe(t, checkpoint, sens_partial_stage,
                          sens_complete_stage, user_data);
}